

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall LINSimulationDataGenerator::CreateBadFrame(LINSimulationDataGenerator *this)

{
  double *pdVar1;
  bool bVar2;
  U8 UVar3;
  U32 UVar4;
  byte local_1d;
  U8 i;
  U32 data_count;
  bool classic_identifier;
  U8 identifier;
  U32 samples_per_bit;
  LINSimulationDataGenerator *this_local;
  
  Random(this,1,4);
  SimulationChannelDescriptor::Advance((int)this + 0x10);
  UVar3 = CreateHeader(this);
  bVar2 = false;
  if ((UVar3 == '<') || (UVar3 == '=')) {
    bVar2 = true;
  }
  pdVar1 = &this->mSettings->mLINVersion;
  if ((*pdVar1 <= 2.0 && *pdVar1 != 2.0) || (bVar2)) {
    LINChecksum::clear(&this->mChecksum);
  }
  Random(this,1,8);
  for (local_1d = 0; local_1d < 5; local_1d = local_1d + 1) {
    UVar4 = Random(this,0,0xff);
    CreateSerialByte(this,(U8)UVar4);
  }
  UVar3 = LINChecksum::result(&this->mChecksum);
  CreateSerialByte(this,UVar3 + '\x03');
  return;
}

Assistant:

void LINSimulationDataGenerator::CreateBadFrame()
{
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;
    mSerialSimulationData.Advance( samples_per_bit * Random( 1, 4 ) ); // simulate jitter
    U8 identifier = CreateHeader();
    bool classic_identifier = false;
    if( identifier == 0x3C || identifier == 0x3D )
        classic_identifier = true;

    if( mSettings->mLINVersion < 2 || classic_identifier == true )
        mChecksum.clear(); // Version 1 starts chksum at first data byte.
    U32 data_count = Random( 1, 8 );

    data_count = 5;
    for( U8 i = 0; i < data_count && i < 8; i++ )
    {
        CreateSerialByte( static_cast<U8>( Random( 0, 255 ) & 0xFF ) );
    }
    CreateSerialByte( mChecksum.result() + 3 );
}